

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O0

void opj_dwt_encode_1_real(OPJ_INT32 *a,OPJ_INT32 dn,OPJ_INT32 sn,OPJ_INT32 cas)

{
  OPJ_INT32 OVar1;
  int iVar2;
  OPJ_INT32 local_c0;
  OPJ_INT32 local_bc;
  OPJ_INT32 local_b4;
  OPJ_INT32 local_b0;
  OPJ_INT32 local_ac;
  OPJ_INT32 local_a8;
  OPJ_INT32 local_a0;
  OPJ_INT32 local_9c;
  OPJ_INT32 local_98;
  OPJ_INT32 local_94;
  OPJ_INT32 local_8c;
  OPJ_INT32 local_88;
  OPJ_INT32 local_84;
  OPJ_INT32 local_80;
  OPJ_INT32 local_78;
  OPJ_INT32 local_74;
  OPJ_INT32 local_70;
  OPJ_INT32 local_6c;
  OPJ_INT32 local_64;
  OPJ_INT32 local_60;
  OPJ_INT32 local_5c;
  OPJ_INT32 local_58;
  OPJ_INT32 local_50;
  OPJ_INT32 local_4c;
  OPJ_INT32 local_48;
  OPJ_INT32 local_44;
  OPJ_INT32 local_3c;
  OPJ_INT32 local_38;
  OPJ_INT32 local_34;
  OPJ_INT32 local_30;
  OPJ_INT32 local_28;
  OPJ_INT32 local_24;
  int local_20;
  OPJ_INT32 i;
  OPJ_INT32 cas_local;
  OPJ_INT32 sn_local;
  OPJ_INT32 dn_local;
  OPJ_INT32 *a_local;
  
  if (cas == 0) {
    if ((0 < dn) || (1 < sn)) {
      for (local_20 = 0; local_20 < dn; local_20 = local_20 + 1) {
        if (local_20 < 0) {
          local_24 = *a;
        }
        else {
          if (local_20 < sn) {
            local_28 = a[local_20 << 1];
          }
          else {
            local_28 = a[(sn + -1) * 2];
          }
          local_24 = local_28;
        }
        if (local_20 + 1 < 0) {
          local_30 = *a;
        }
        else {
          if (local_20 + 1 < sn) {
            local_34 = a[(local_20 + 1) * 2];
          }
          else {
            local_34 = a[(sn + -1) * 2];
          }
          local_30 = local_34;
        }
        OVar1 = opj_int_fix_mul(local_24 + local_30,0x32c1);
        iVar2 = local_20 * 2 + 1;
        a[iVar2] = a[iVar2] - OVar1;
      }
      for (local_20 = 0; local_20 < sn; local_20 = local_20 + 1) {
        if (local_20 + -1 < 0) {
          local_38 = a[1];
        }
        else {
          if (local_20 + -1 < dn) {
            local_3c = a[(local_20 + -1) * 2 + 1];
          }
          else {
            local_3c = a[(dn + -1) * 2 + 1];
          }
          local_38 = local_3c;
        }
        if (local_20 < 0) {
          local_44 = a[1];
        }
        else {
          if (local_20 < dn) {
            local_48 = a[local_20 * 2 + 1];
          }
          else {
            local_48 = a[(dn + -1) * 2 + 1];
          }
          local_44 = local_48;
        }
        OVar1 = opj_int_fix_mul(local_38 + local_44,0x1b2);
        a[local_20 << 1] = a[local_20 << 1] - OVar1;
      }
      for (local_20 = 0; local_20 < dn; local_20 = local_20 + 1) {
        if (local_20 < 0) {
          local_4c = *a;
        }
        else {
          if (local_20 < sn) {
            local_50 = a[local_20 << 1];
          }
          else {
            local_50 = a[(sn + -1) * 2];
          }
          local_4c = local_50;
        }
        if (local_20 + 1 < 0) {
          local_58 = *a;
        }
        else {
          if (local_20 + 1 < sn) {
            local_5c = a[(local_20 + 1) * 2];
          }
          else {
            local_5c = a[(sn + -1) * 2];
          }
          local_58 = local_5c;
        }
        OVar1 = opj_int_fix_mul(local_4c + local_58,0x1c41);
        iVar2 = local_20 * 2 + 1;
        a[iVar2] = OVar1 + a[iVar2];
      }
      for (local_20 = 0; local_20 < sn; local_20 = local_20 + 1) {
        if (local_20 + -1 < 0) {
          local_60 = a[1];
        }
        else {
          if (local_20 + -1 < dn) {
            local_64 = a[(local_20 + -1) * 2 + 1];
          }
          else {
            local_64 = a[(dn + -1) * 2 + 1];
          }
          local_60 = local_64;
        }
        if (local_20 < 0) {
          local_6c = a[1];
        }
        else {
          if (local_20 < dn) {
            local_70 = a[local_20 * 2 + 1];
          }
          else {
            local_70 = a[(dn + -1) * 2 + 1];
          }
          local_6c = local_70;
        }
        OVar1 = opj_int_fix_mul(local_60 + local_6c,0xe31);
        a[local_20 << 1] = OVar1 + a[local_20 << 1];
      }
      for (local_20 = 0; local_20 < dn; local_20 = local_20 + 1) {
        OVar1 = opj_int_fix_mul(a[local_20 * 2 + 1],0x13ae);
        a[local_20 * 2 + 1] = OVar1;
      }
      for (local_20 = 0; local_20 < sn; local_20 = local_20 + 1) {
        OVar1 = opj_int_fix_mul(a[local_20 << 1],0x1a03);
        a[local_20 << 1] = OVar1;
      }
    }
  }
  else if ((0 < sn) || (1 < dn)) {
    for (local_20 = 0; local_20 < dn; local_20 = local_20 + 1) {
      if (local_20 < 0) {
        local_74 = a[1];
      }
      else {
        if (local_20 < sn) {
          local_78 = a[local_20 * 2 + 1];
        }
        else {
          local_78 = a[(sn + -1) * 2 + 1];
        }
        local_74 = local_78;
      }
      if (local_20 + -1 < 0) {
        local_80 = a[1];
      }
      else {
        if (local_20 + -1 < sn) {
          local_84 = a[(local_20 + -1) * 2 + 1];
        }
        else {
          local_84 = a[(sn + -1) * 2 + 1];
        }
        local_80 = local_84;
      }
      OVar1 = opj_int_fix_mul(local_74 + local_80,0x32c1);
      a[local_20 << 1] = a[local_20 << 1] - OVar1;
    }
    for (local_20 = 0; local_20 < sn; local_20 = local_20 + 1) {
      if (local_20 < 0) {
        local_88 = *a;
      }
      else {
        if (local_20 < dn) {
          local_8c = a[local_20 << 1];
        }
        else {
          local_8c = a[(dn + -1) * 2];
        }
        local_88 = local_8c;
      }
      if (local_20 + 1 < 0) {
        local_94 = *a;
      }
      else {
        if (local_20 + 1 < dn) {
          local_98 = a[(local_20 + 1) * 2];
        }
        else {
          local_98 = a[(dn + -1) * 2];
        }
        local_94 = local_98;
      }
      OVar1 = opj_int_fix_mul(local_88 + local_94,0x1b2);
      iVar2 = local_20 * 2 + 1;
      a[iVar2] = a[iVar2] - OVar1;
    }
    for (local_20 = 0; local_20 < dn; local_20 = local_20 + 1) {
      if (local_20 < 0) {
        local_9c = a[1];
      }
      else {
        if (local_20 < sn) {
          local_a0 = a[local_20 * 2 + 1];
        }
        else {
          local_a0 = a[(sn + -1) * 2 + 1];
        }
        local_9c = local_a0;
      }
      if (local_20 + -1 < 0) {
        local_a8 = a[1];
      }
      else {
        if (local_20 + -1 < sn) {
          local_ac = a[(local_20 + -1) * 2 + 1];
        }
        else {
          local_ac = a[(sn + -1) * 2 + 1];
        }
        local_a8 = local_ac;
      }
      OVar1 = opj_int_fix_mul(local_9c + local_a8,0x1c41);
      a[local_20 << 1] = OVar1 + a[local_20 << 1];
    }
    for (local_20 = 0; local_20 < sn; local_20 = local_20 + 1) {
      if (local_20 < 0) {
        local_b0 = *a;
      }
      else {
        if (local_20 < dn) {
          local_b4 = a[local_20 << 1];
        }
        else {
          local_b4 = a[(dn + -1) * 2];
        }
        local_b0 = local_b4;
      }
      if (local_20 + 1 < 0) {
        local_bc = *a;
      }
      else {
        if (local_20 + 1 < dn) {
          local_c0 = a[(local_20 + 1) * 2];
        }
        else {
          local_c0 = a[(dn + -1) * 2];
        }
        local_bc = local_c0;
      }
      OVar1 = opj_int_fix_mul(local_b0 + local_bc,0xe31);
      iVar2 = local_20 * 2 + 1;
      a[iVar2] = OVar1 + a[iVar2];
    }
    for (local_20 = 0; local_20 < dn; local_20 = local_20 + 1) {
      OVar1 = opj_int_fix_mul(a[local_20 << 1],0x13ae);
      a[local_20 << 1] = OVar1;
    }
    for (local_20 = 0; local_20 < sn; local_20 = local_20 + 1) {
      OVar1 = opj_int_fix_mul(a[local_20 * 2 + 1],0x1a03);
      a[local_20 * 2 + 1] = OVar1;
    }
  }
  return;
}

Assistant:

static void opj_dwt_encode_1_real(OPJ_INT32 *a, OPJ_INT32 dn, OPJ_INT32 sn,
                                  OPJ_INT32 cas)
{
    OPJ_INT32 i;
    if (!cas) {
        if ((dn > 0) || (sn > 1)) { /* NEW :  CASE ONE ELEMENT */
            for (i = 0; i < dn; i++) {
                OPJ_D(i) -= opj_int_fix_mul(OPJ_S_(i) + OPJ_S_(i + 1), 12993);
            }
            for (i = 0; i < sn; i++) {
                OPJ_S(i) -= opj_int_fix_mul(OPJ_D_(i - 1) + OPJ_D_(i), 434);
            }
            for (i = 0; i < dn; i++) {
                OPJ_D(i) += opj_int_fix_mul(OPJ_S_(i) + OPJ_S_(i + 1), 7233);
            }
            for (i = 0; i < sn; i++) {
                OPJ_S(i) += opj_int_fix_mul(OPJ_D_(i - 1) + OPJ_D_(i), 3633);
            }
            for (i = 0; i < dn; i++) {
                OPJ_D(i) = opj_int_fix_mul(OPJ_D(i), 5038);    /*5038 */
            }
            for (i = 0; i < sn; i++) {
                OPJ_S(i) = opj_int_fix_mul(OPJ_S(i), 6659);    /*6660 */
            }
        }
    } else {
        if ((sn > 0) || (dn > 1)) { /* NEW :  CASE ONE ELEMENT */
            for (i = 0; i < dn; i++) {
                OPJ_S(i) -= opj_int_fix_mul(OPJ_DD_(i) + OPJ_DD_(i - 1), 12993);
            }
            for (i = 0; i < sn; i++) {
                OPJ_D(i) -= opj_int_fix_mul(OPJ_SS_(i) + OPJ_SS_(i + 1), 434);
            }
            for (i = 0; i < dn; i++) {
                OPJ_S(i) += opj_int_fix_mul(OPJ_DD_(i) + OPJ_DD_(i - 1), 7233);
            }
            for (i = 0; i < sn; i++) {
                OPJ_D(i) += opj_int_fix_mul(OPJ_SS_(i) + OPJ_SS_(i + 1), 3633);
            }
            for (i = 0; i < dn; i++) {
                OPJ_S(i) = opj_int_fix_mul(OPJ_S(i), 5038);    /*5038 */
            }
            for (i = 0; i < sn; i++) {
                OPJ_D(i) = opj_int_fix_mul(OPJ_D(i), 6659);    /*6660 */
            }
        }
    }
}